

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

void Assimp::IFC::FilterPolygon
               (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *resultpoly)

{
  bool bVar1;
  size_type sVar2;
  aiVector3t<double> *in;
  reference a;
  reference b;
  double dVar3;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_90;
  aiVector3t<double> *local_88;
  aiVector3t<double> *local_80;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_78;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_70;
  iterator e;
  FuzzyVectorCompare fz;
  IfcFloat epsilon;
  IfcVector3 vmax;
  IfcVector3 vmin;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *resultpoly_local;
  
  sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(resultpoly);
  if (sVar2 < 3) {
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::clear(resultpoly);
  }
  else {
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vmax.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&epsilon);
    in = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::data(resultpoly);
    sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(resultpoly);
    ArrayBounds<aiVector3t<double>>
              (in,(uint)sVar2,(aiVector3t<double> *)&vmax.z,(aiVector3t<double> *)&epsilon);
    ::operator-((aiVector3t<double> *)&fz,(aiVector3t<double> *)&epsilon,
                (aiVector3t<double> *)&vmax.z);
    dVar3 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&fz);
    FuzzyVectorCompare::FuzzyVectorCompare((FuzzyVectorCompare *)&e,dVar3 / 1000000.0);
    local_78._M_current =
         (aiVector3t<double> *)
         std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin(resultpoly);
    local_80 = (aiVector3t<double> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (resultpoly);
    local_88 = e._M_current;
    local_70 = std::
               unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,Assimp::IFC::FuzzyVectorCompare>
                         (local_78,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                    )local_80,e._M_current);
    local_90._M_current =
         (aiVector3t<double> *)
         std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(resultpoly);
    bVar1 = __gnu_cxx::operator!=(&local_70,&local_90);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
      ::__normal_iterator<aiVector3t<double>*>
                ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                  *)&local_98,&local_70);
      local_a8._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(resultpoly);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
      ::__normal_iterator<aiVector3t<double>*>
                ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                  *)&local_a0,&local_a8);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                (resultpoly,local_98,local_a0);
    }
    bVar1 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty(resultpoly)
    ;
    if (!bVar1) {
      a = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::front(resultpoly);
      b = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::back(resultpoly);
      bVar1 = FuzzyVectorCompare::operator()((FuzzyVectorCompare *)&e,a,b);
      if (bVar1) {
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back(resultpoly);
      }
    }
  }
  return;
}

Assistant:

void FilterPolygon(std::vector<IfcVector3>& resultpoly)
{
    if( resultpoly.size() < 3 )
    {
        resultpoly.clear();
        return;
    }

    IfcVector3 vmin, vmax;
    ArrayBounds(resultpoly.data(), static_cast<unsigned int>(resultpoly.size()), vmin, vmax);

    // filter our IfcFloat points - those may happen if a point lies
    // directly on the intersection line or directly on the clipping plane
    const IfcFloat epsilon = (vmax - vmin).SquareLength() / 1e6f;
    FuzzyVectorCompare fz(epsilon);
    std::vector<IfcVector3>::iterator e = std::unique(resultpoly.begin(), resultpoly.end(), fz);

    if( e != resultpoly.end() )
        resultpoly.erase(e, resultpoly.end());

    if( !resultpoly.empty() && fz(resultpoly.front(), resultpoly.back()) )
        resultpoly.pop_back();
}